

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal.cpp
# Opt level: O2

string * __thiscall
duckdb::Decimal::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Decimal *this,hugeint_t value,uint8_t width,uint8_t scale)

{
  uint uVar1;
  tuple<char_*,_std::default_delete<char[]>_> tVar2;
  hugeint_t value_00;
  hugeint_t value_01;
  unique_ptr<char[],_std::default_delete<char>,_false> data;
  idx_t in_stack_ffffffffffffffb8;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_38;
  
  value_00.upper._4_4_ = 0;
  value_00._0_12_ = value._0_12_;
  uVar1 = DecimalToString::DecimalLength<duckdb::hugeint_t>
                    ((DecimalToString *)this,value_00,width,width);
  tVar2.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)
       operator_new__((long)(int)(uVar1 + 1));
  value_01.upper._4_4_ = 0;
  value_01._0_12_ = value._0_12_;
  local_38._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (tuple<char_*,_std::default_delete<char[]>_>)
       tVar2.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  DecimalToString::FormatDecimal<duckdb::hugeint_t>
            ((DecimalToString *)this,value_01,width,
             (uint8_t)tVar2.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                      super__Head_base<0UL,_char_*,_false>._M_head_impl,(char *)(long)(int)uVar1,
             in_stack_ffffffffffffffb8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             tVar2.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl,
             (ulong)uVar1 +
             (long)tVar2.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl);
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string Decimal::ToString(hugeint_t value, uint8_t width, uint8_t scale) {
	auto len = DecimalToString::DecimalLength(value, width, scale);
	auto data = make_unsafe_uniq_array_uninitialized<char>(UnsafeNumericCast<size_t>(len + 1));
	DecimalToString::FormatDecimal(value, width, scale, data.get(), UnsafeNumericCast<idx_t>(len));
	return string(data.get(), UnsafeNumericCast<uint32_t>(len));
}